

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_txt_emit.h
# Opt level: O2

char * sh4asm_disp8_str(uint disp8,uint shift)

{
  byte bVar1;
  char *in_RAX;
  
  bVar1 = (byte)shift;
  snprintf(sh4asm_disp8_str::buf,8,"%d",
           (ulong)((0x100 << (bVar1 & 0x1f)) - 1U & (disp8 >> (bVar1 & 0x1f)) << (bVar1 & 0x1f)));
  sh4asm_disp8_str::buf[7] = '\0';
  return in_RAX;
}

Assistant:

static char const *sh4asm_disp8_str(unsigned disp8, unsigned shift) {
    // TODO: pad output to two hex digits
    static char buf[8];
    snprintf(buf, sizeof(buf), "%d", //"0x%02x",
             disp8 & ((256 << shift) - 1) & ~((1 << shift)-1));
    buf[7] = '\0';
    return buf;
}